

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

Vector2f __thiscall Rml::Element::GetRelativeOffset(Element *this,BoxArea area)

{
  float fVar1;
  float fVar2;
  Vector2f VVar3;
  Vector2f VVar4;
  Vector2f VVar5;
  
  VVar3 = this->relative_offset_position;
  fVar1 = (this->relative_offset_base).x;
  fVar2 = (this->relative_offset_base).y;
  VVar5 = Box::GetPosition(&this->main_box,area);
  VVar4.y = VVar5.y + VVar3.y + fVar2;
  VVar4.x = fVar1 + VVar3.x + VVar5.x;
  return VVar4;
}

Assistant:

Vector2f Element::GetRelativeOffset(BoxArea area)
{
	return relative_offset_base + relative_offset_position + GetBox().GetPosition(area);
}